

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O1

void blend_a64_mask_b12_sx_sy_w4_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar5 [16];
  undefined2 uVar6;
  short sVar8;
  undefined2 uVar9;
  short sVar10;
  undefined2 uVar11;
  short sVar12;
  undefined2 uVar13;
  undefined1 auVar7 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  auVar4 = _DAT_004ca110;
  auVar5 = pmovsxbw(in_XMM4,0x4040404040404040);
  do {
    uVar1 = *(undefined8 *)mask;
    uVar2 = *(undefined8 *)(mask + mask_stride);
    auVar14[0] = (char)uVar2 + (char)uVar1;
    auVar14[1] = (char)((ulong)uVar2 >> 8) + (char)((ulong)uVar1 >> 8);
    auVar14[2] = (char)((ulong)uVar2 >> 0x10) + (char)((ulong)uVar1 >> 0x10);
    auVar14[3] = (char)((ulong)uVar2 >> 0x18) + (char)((ulong)uVar1 >> 0x18);
    auVar14[4] = (char)((ulong)uVar2 >> 0x20) + (char)((ulong)uVar1 >> 0x20);
    auVar14[5] = (char)((ulong)uVar2 >> 0x28) + (char)((ulong)uVar1 >> 0x28);
    auVar14[6] = (char)((ulong)uVar2 >> 0x30) + (char)((ulong)uVar1 >> 0x30);
    auVar14[7] = (char)((ulong)uVar2 >> 0x38) + (char)((ulong)uVar1 >> 0x38);
    auVar14._8_8_ = 0;
    auVar7 = pshufb(auVar14,ZEXT816(0xe0c0a0806040200));
    auVar15 = pshufb(auVar14,ZEXT816(0xf0d0b0907050301));
    auVar18 = auVar15 & auVar7;
    auVar15 = auVar15 ^ auVar7;
    auVar16._0_2_ = auVar15._0_2_ >> 1;
    auVar16._2_2_ = auVar15._2_2_ >> 1;
    auVar16._4_2_ = auVar15._4_2_ >> 1;
    auVar16._6_2_ = auVar15._6_2_ >> 1;
    auVar16._8_2_ = auVar15._8_2_ >> 1;
    auVar16._10_2_ = auVar15._10_2_ >> 1;
    auVar16._12_2_ = auVar15._12_2_ >> 1;
    auVar16._14_2_ = auVar15._14_2_ >> 1;
    auVar16 = auVar16 & auVar4;
    auVar17[0] = auVar16[0] + auVar18[0];
    auVar17[1] = auVar16[1] + auVar18[1];
    auVar17[2] = auVar16[2] + auVar18[2];
    auVar17[3] = auVar16[3] + auVar18[3];
    auVar17[4] = auVar16[4] + auVar18[4];
    auVar17[5] = auVar16[5] + auVar18[5];
    auVar17[6] = auVar16[6] + auVar18[6];
    auVar17[7] = auVar16[7] + auVar18[7];
    auVar17[8] = auVar16[8] + auVar18[8];
    auVar17[9] = auVar16[9] + auVar18[9];
    auVar17[10] = auVar16[10] + auVar18[10];
    auVar17[0xb] = auVar16[0xb] + auVar18[0xb];
    auVar17[0xc] = auVar16[0xc] + auVar18[0xc];
    auVar17[0xd] = auVar16[0xd] + auVar18[0xd];
    auVar17[0xe] = auVar16[0xe] + auVar18[0xe];
    auVar17[0xf] = auVar16[0xf] + auVar18[0xf];
    auVar7 = pmovzxbw(auVar7,auVar17);
    auVar15._0_2_ = pavgw(auVar7._0_2_,0);
    sVar8 = pavgw(auVar7._2_2_,0);
    sVar10 = pavgw(auVar7._4_2_,0);
    sVar12 = pavgw(auVar7._6_2_,0);
    pavgw(auVar7._8_2_,0);
    pavgw(auVar7._10_2_,0);
    pavgw(auVar7._12_2_,0);
    pavgw(auVar7._14_2_,0);
    uVar3 = *(ulong *)src0;
    uVar1 = *(undefined8 *)src1;
    auVar21._8_4_ = 0;
    auVar21._0_8_ = uVar3;
    auVar21._12_2_ = (short)(uVar3 >> 0x30);
    auVar21._14_2_ = (short)((ulong)uVar1 >> 0x30);
    auVar20._12_4_ = auVar21._12_4_;
    auVar20._8_2_ = 0;
    auVar20._0_8_ = uVar3;
    auVar20._10_2_ = (short)((ulong)uVar1 >> 0x20);
    auVar19._10_6_ = auVar20._10_6_;
    auVar19._8_2_ = (short)(uVar3 >> 0x20);
    auVar19._0_8_ = uVar3;
    auVar7._8_8_ = auVar19._8_8_;
    auVar7._6_2_ = (short)((ulong)uVar1 >> 0x10);
    auVar7._4_2_ = (short)(uVar3 >> 0x10);
    auVar7._0_2_ = (undefined2)uVar3;
    auVar7._2_2_ = (short)uVar1;
    auVar15._8_8_ =
         (undefined8)
         (CONCAT64(CONCAT42(CONCAT22(auVar5._6_2_ - sVar12,sVar12),auVar5._4_2_ - sVar10),
                   CONCAT22(sVar10,sVar12)) >> 0x10);
    auVar15._6_2_ = auVar5._2_2_ - sVar8;
    auVar15._4_2_ = sVar8;
    auVar15._2_2_ = auVar5._0_2_ - auVar15._0_2_;
    auVar7 = pmaddwd(auVar15,auVar7);
    auVar18._0_4_ = auVar7._0_4_ >> 5;
    auVar18._4_4_ = auVar7._4_4_ >> 5;
    auVar18._8_4_ = auVar7._8_4_ >> 5;
    auVar18._12_4_ = auVar7._12_4_ >> 5;
    auVar7 = packssdw(auVar18,auVar18);
    uVar6 = pavgw(auVar7._0_2_,0);
    uVar9 = pavgw(auVar7._2_2_,0);
    uVar11 = pavgw(auVar7._4_2_,0);
    uVar13 = pavgw(auVar7._6_2_,0);
    pavgw(auVar7._8_2_,0);
    pavgw(auVar7._10_2_,0);
    pavgw(auVar7._12_2_,0);
    pavgw(auVar7._14_2_,0);
    *(ulong *)dst = CONCAT26(uVar13,CONCAT24(uVar11,CONCAT22(uVar9,uVar6)));
    mask = mask + mask_stride * 2;
    src1 = src1 + src1_stride;
    src0 = (uint16_t *)((long)src0 + (ulong)src0_stride * 2);
    dst = dst + dst_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_b12_sx_sy_w4_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  (void)w;
  blend_a64_mask_bn_sx_sy_w4_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                                    src1_stride, mask, mask_stride, h,
                                    blend_4_b12);
}